

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

void int_plus(IntVar *x,IntVar *y,IntVar *z)

{
  int local_74;
  IntVar *local_70;
  vec<IntVar_*> local_68;
  vec<int> local_58;
  IntVar *local_40;
  IntVar *local_38;
  
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  local_68.sz = 0;
  local_68.cap = 0;
  local_68.data = (IntVar **)0x0;
  local_74 = 1;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&local_38);
  local_74 = 1;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&local_40);
  local_74 = -1;
  vec<int>::push(&local_58,&local_74);
  vec<IntVar_*>::push(&local_68,&local_70);
  int_linear(&local_58,&local_68,IRT_EQ,0,&bv_true);
  if (local_68.data != (IntVar **)0x0) {
    free(local_68.data);
  }
  if (local_58.data != (int *)0x0) {
    free(local_58.data);
  }
  return;
}

Assistant:

void int_plus(IntVar* x, IntVar* y, IntVar* z) {
	vec<int> coeffs;
	vec<IntVar*> w;
	coeffs.push(1);
	w.push(x);
	coeffs.push(1);
	w.push(y);
	coeffs.push(-1);
	w.push(z);
	int_linear(coeffs, w, IRT_EQ, 0);
}